

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O3

void __thiscall disp::h1_s_r(disp *this,string *param)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"h1_s_r:",param);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void h1_s_r(std::string &param)
	{
		v_= "h1_s_r:"+param;
	}